

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

int __thiscall Board::get_winner(Board *this)

{
  mapped_type *pmVar1;
  int iVar2;
  uint i;
  int iVar3;
  int iVar4;
  int local_2c;
  
  iVar4 = 0x7fff;
  iVar3 = 1;
  iVar2 = 0;
  do {
    local_2c = iVar3;
    pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_player_scores,&local_2c);
    if (*pmVar1 < iVar4) {
      iVar4 = *pmVar1;
      iVar2 = iVar3;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 5);
  return iVar2;
}

Assistant:

int Board::get_winner()
{
    int winner = 0;
    int lowest_score = INT16_MAX;

    for (unsigned int i(1); i < 5; ++i) {
        int current_score = m_player_scores[i];
        if (current_score < lowest_score) {
            lowest_score = current_score;
            winner = i;
        }
    }

    return  winner;
}